

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode cr_exp100_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *nread,
                       _Bool *eos)

{
  int iVar1;
  void *pvVar2;
  curl_trc_feat *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  timediff_t tVar6;
  curltime cVar7;
  curltime newer;
  
  pvVar2 = reader->ctx;
  iVar1 = *(int *)((long)pvVar2 + 0x30);
  if (iVar1 == 1) {
    cVar7 = Curl_now();
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar7._0_12_,0);
    newer.tv_usec = SUB124(cVar7._0_12_,8);
    cVar7._12_4_ = 0;
    cVar7._0_12_ = *(undefined1 (*) [12])((long)pvVar2 + 0x20);
    tVar6 = Curl_timediff(newer,cVar7);
    if ((data->set).expect_100_timeout <= tVar6) {
      http_exp100_continue(data,reader);
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
      {
        Curl_infof(data,"Done waiting for 100-continue");
      }
      goto LAB_00135216;
    }
    (data->req).keepon = (data->req).keepon & 0xffffffbdU | 0x40;
    *nread = 0;
    *eos = false;
  }
  else {
    if (iVar1 == 3) {
      *nread = 0;
      *eos = false;
      return CURLE_READ_ERROR;
    }
    if (iVar1 != 2) {
LAB_00135216:
      CVar5 = Curl_creader_read(data,reader->next,buf,blen,nread,eos);
      return CVar5;
    }
    _Var4 = Curl_req_sendbuf_empty(data);
    if (_Var4) {
      *(undefined4 *)((long)pvVar2 + 0x30) = 1;
      cVar7 = Curl_now();
      *(time_t *)((long)pvVar2 + 0x20) = cVar7.tv_sec;
      *(int *)((long)pvVar2 + 0x28) = cVar7.tv_usec;
      Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
      (data->req).keepon = (data->req).keepon & 0xffffffbdU | 0x40;
      *nread = 0;
      *eos = false;
      return CURLE_OK;
    }
    *nread = 0;
    *eos = false;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cr_exp100_read(struct Curl_easy *data,
                               struct Curl_creader *reader,
                               char *buf, size_t blen,
                               size_t *nread, bool *eos)
{
  struct cr_exp100_ctx *ctx = reader->ctx;
  timediff_t ms;

  switch(ctx->state) {
  case EXP100_SENDING_REQUEST:
    if(!Curl_req_sendbuf_empty(data)) {
      /* The initial request data has not been fully sent yet. Do
       * not start the timer yet. */
      DEBUGF(infof(data, "cr_exp100_read, request not full sent yet"));
      *nread = 0;
      *eos = FALSE;
      return CURLE_OK;
    }
    /* We are now waiting for a reply from the server or
     * a timeout on our side IFF the request has been fully sent. */
    DEBUGF(infof(data, "cr_exp100_read, start AWAITING_CONTINUE, "
           "timeout %ldms", data->set.expect_100_timeout));
    ctx->state = EXP100_AWAITING_CONTINUE;
    ctx->start = Curl_now();
    Curl_expire(data, data->set.expect_100_timeout, EXPIRE_100_TIMEOUT);
    data->req.keepon &= ~KEEP_SEND;
    data->req.keepon |= KEEP_SEND_TIMED;
    *nread = 0;
    *eos = FALSE;
    return CURLE_OK;
  case EXP100_FAILED:
    DEBUGF(infof(data, "cr_exp100_read, expectation failed, error"));
    *nread = 0;
    *eos = FALSE;
    return CURLE_READ_ERROR;
  case EXP100_AWAITING_CONTINUE:
    ms = Curl_timediff(Curl_now(), ctx->start);
    if(ms < data->set.expect_100_timeout) {
      DEBUGF(infof(data, "cr_exp100_read, AWAITING_CONTINUE, not expired"));
      data->req.keepon &= ~KEEP_SEND;
      data->req.keepon |= KEEP_SEND_TIMED;
      *nread = 0;
      *eos = FALSE;
      return CURLE_OK;
    }
    /* we have waited long enough, continue anyway */
    http_exp100_continue(data, reader);
    infof(data, "Done waiting for 100-continue");
    FALLTHROUGH();
  default:
    DEBUGF(infof(data, "cr_exp100_read, pass through"));
    return Curl_creader_read(data, reader->next, buf, blen, nread, eos);
  }
}